

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

void __thiscall
particleSamples::boostParticles
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *input_particle_list,double rap_shift)

{
  double dVar1;
  double dVar2;
  pointer ppvVar3;
  pointer paVar4;
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  pointer ppvVar5;
  anon_struct_120_15_f999644b *part_i;
  pointer paVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  ppvVar3 = (input_particle_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppvVar5 = (input_particle_list->
                 super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppvVar5 != ppvVar3;
      ppvVar5 = ppvVar5 + 1) {
    paVar4 = ((*ppvVar5)->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    for (paVar6 = ((*ppvVar5)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                  _M_impl.super__Vector_impl_data._M_start; paVar6 != paVar4; paVar6 = paVar6 + 1) {
      dVar7 = paVar6->px * paVar6->px + paVar6->py * paVar6->py;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      paVar6->pT = dVar7;
      dVar7 = atan2(paVar6->py,paVar6->px);
      paVar6->phi_p = dVar7;
      dVar7 = paVar6->E;
      dVar8 = cosh(rap_shift);
      dVar1 = paVar6->pz;
      dVar9 = sinh(rap_shift);
      dVar12 = paVar6->pz;
      dVar10 = cosh(rap_shift);
      dVar2 = paVar6->E;
      dVar11 = sinh(rap_shift);
      dVar12 = dVar10 * dVar12 + dVar11 * dVar2;
      dVar7 = dVar8 * dVar7 + dVar9 * dVar1;
      paVar6->pz = dVar12;
      paVar6->E = dVar7;
      dVar7 = log((dVar7 + dVar12) / (dVar7 - dVar12));
      paVar6->rap_y = dVar7 * 0.5;
      dVar7 = paVar6->pT * paVar6->pT + paVar6->pz * paVar6->pz;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar7 = log((dVar7 + paVar6->pz) / (dVar7 - paVar6->pz));
      paVar6->rap_eta = dVar7 * 0.5;
    }
  }
  return;
}

Assistant:

void particleSamples::boostParticles(
    vector<vector<particle_info> *> *input_particle_list,
    const double rap_shift) {
    for (auto &ev_i : (*input_particle_list)) {
        for (auto &part_i : (*ev_i)) {
            part_i.pT = sqrt(part_i.px * part_i.px + part_i.py * part_i.py);
            part_i.phi_p = atan2(part_i.py, part_i.px);
            double E_shifted =
                (part_i.E * cosh(rap_shift) + part_i.pz * sinh(rap_shift));
            double pz_shifted =
                (part_i.pz * cosh(rap_shift) + part_i.E * sinh(rap_shift));
            part_i.E = E_shifted;
            part_i.pz = pz_shifted;

            part_i.rap_y =
                0.5 * log((part_i.E + part_i.pz) / (part_i.E - part_i.pz));
            double p_mag = sqrt(part_i.pT * part_i.pT + part_i.pz * part_i.pz);
            part_i.rap_eta =
                0.5 * log((p_mag + part_i.pz) / (p_mag - part_i.pz));
        }
    }
}